

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::Reader::decodeString(Reader *this,Token *token,string *decoded)

{
  char cVar1;
  bool bVar2;
  uint cp;
  Location end;
  Location extra;
  uint unicode;
  Reader *local_60;
  Location local_58;
  string local_50;
  
  local_60 = this;
  std::__cxx11::string::reserve((ulong)decoded);
  end = token->end_ + -1;
  local_58 = token->start_ + 1;
LAB_003cc199:
  do {
    if (local_58 == end) {
      return true;
    }
    extra = local_58 + 1;
    if (*local_58 != '\\') {
      if (*local_58 == '\"') {
        return true;
      }
      goto LAB_003cc2a2;
    }
    if (extra == end) {
      local_58 = extra;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Empty escape sequence in string",(allocator<char> *)&unicode);
      addError(local_60,&local_50,token,extra);
      goto LAB_003cc2da;
    }
    extra = local_58 + 2;
    cVar1 = local_58[1];
    local_58 = extra;
    switch(cVar1) {
    case 'n':
      break;
    case 'o':
    case 'p':
    case 'q':
    case 's':
switchD_003cc225_caseD_6f:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Bad escape sequence in string",(allocator<char> *)&unicode);
      addError(local_60,&local_50,token,extra);
LAB_003cc2da:
      std::__cxx11::string::~string((string *)&local_50);
      return false;
    case 'r':
      break;
    case 't':
      break;
    case 'u':
      goto switchD_003cc225_caseD_75;
    default:
      if ((((cVar1 != 'f') && (cVar1 != '/')) && (cVar1 != '\\')) &&
         ((cVar1 != 'b' && (cVar1 != '\"')))) goto switchD_003cc225_caseD_6f;
    }
LAB_003cc2a2:
    local_58 = extra;
    std::__cxx11::string::push_back((char)decoded);
    local_58 = extra;
  } while( true );
switchD_003cc225_caseD_75:
  bVar2 = decodeUnicodeCodePoint(local_60,token,&local_58,end,&unicode);
  if (!bVar2) {
    return false;
  }
  codePointToUTF8_abi_cxx11_(&local_50,(Json *)(ulong)unicode,cp);
  std::__cxx11::string::append((string *)decoded);
  std::__cxx11::string::~string((string *)&local_50);
  goto LAB_003cc199;
}

Assistant:

bool Reader::decodeString(Token& token, JSONCPP_STRING& decoded) {
  decoded.reserve(static_cast<size_t>(token.end_ - token.start_ - 2));
  Location current = token.start_ + 1; // skip '"'
  Location end = token.end_ - 1;       // do not include '"'
  while (current != end) {
    Char c = *current++;
    if (c == '"')
      break;
    else if (c == '\\') {
      if (current == end)
        return addError("Empty escape sequence in string", token, current);
      Char escape = *current++;
      switch (escape) {
      case '"':
        decoded += '"';
        break;
      case '/':
        decoded += '/';
        break;
      case '\\':
        decoded += '\\';
        break;
      case 'b':
        decoded += '\b';
        break;
      case 'f':
        decoded += '\f';
        break;
      case 'n':
        decoded += '\n';
        break;
      case 'r':
        decoded += '\r';
        break;
      case 't':
        decoded += '\t';
        break;
      case 'u': {
        unsigned int unicode;
        if (!decodeUnicodeCodePoint(token, current, end, unicode))
          return false;
        decoded += codePointToUTF8(unicode);
      } break;
      default:
        return addError("Bad escape sequence in string", token, current);
      }
    } else {
      decoded += c;
    }
  }
  return true;
}